

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.hpp
# Opt level: O1

csv<double> * argagg::convert::converter<argagg::csv<double>_>::convert(char *s)

{
  iterator iVar1;
  bool bVar2;
  vector<double,_std::allocator<double>_> *in_RDI;
  double value;
  double local_28;
  char *local_20;
  
  (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  while( true ) {
    bVar2 = parse_next_component<double>(&local_20,&local_28,',');
    if (!bVar2) break;
    iVar1._M_current =
         (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                (in_RDI,iVar1,&local_28);
    }
    else {
      *iVar1._M_current = local_28;
      (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_finish = iVar1._M_current + 1;
    }
  }
  iVar1._M_current =
       (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data
       ._M_finish;
  if (iVar1._M_current ==
      (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>(in_RDI,iVar1,&local_28);
  }
  else {
    *iVar1._M_current = local_28;
    (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = iVar1._M_current + 1;
  }
  return (csv<double> *)in_RDI;
}

Assistant:

csv<T>
converter<csv<T>>::convert(const char* s)
{
  csv<T> result {{}};
  T value;
  while (parse_next_component(s, value, ',')) {
    result.values.emplace_back(std::move(value));
  }
  result.values.emplace_back(std::move(value));
  return result;
}